

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O2

void bandit::it(char *desc,voidfunc_t *func,listener *listener,contextstack_t *context_stack,
               assertion_adapter *assertion_adapter,run_policy *run_policy)

{
  int iVar1;
  _Elt_pointer ppcVar2;
  function<void_()> *this;
  bool we_have_been_successful_so_far;
  string err;
  anon_class_8_1_00c47a18 run_after_eaches;
  anon_class_8_1_00c47a18 run_before_eaches;
  char *local_108;
  undefined1 local_f9;
  anon_class_32_4_7d280cb4 local_f8 [2];
  anon_class_8_1_00c47a18 local_a0;
  function<void_()> local_98;
  _Function_base local_78;
  anon_class_8_1_00c47a18 local_58;
  function<void_()> local_50;
  
  local_108 = desc;
  iVar1 = (*run_policy->_vptr_run_policy[2])(run_policy,desc,context_stack);
  if ((char)iVar1 == '\0') {
    std::function<void_()>::function(&local_50,func);
    (*listener->_vptr_listener[0xb])(listener,desc);
    this = &local_50;
  }
  else {
    (*listener->_vptr_listener[7])(listener,desc);
    ppcVar2 = (context_stack->
              super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
              )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar2 ==
        (context_stack->
        super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>).
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar2 = (context_stack->
                super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    (*ppcVar2[-1]->_vptr_context[3])();
    local_f8[0].run_after_eaches = &local_58;
    local_f9 = 0;
    local_f8[0].we_have_been_successful_so_far = (bool *)func;
    local_f8[0].listener = (listener *)&local_f9;
    local_a0.context_stack = context_stack;
    local_58.context_stack = context_stack;
    std::function<void()>::
    function<bandit::it(char_const*,std::function<void()>,bandit::detail::listener&,std::deque<bandit::detail::context*,std::allocator<bandit::detail::context*>>&,bandit::adapters::assertion_adapter&,bandit::detail::run_policy&)::_lambda()_3_,void>
              ((function<void()> *)&local_78,(anon_class_24_3_745af3ac *)local_f8);
    (*(code *)**(undefined8 **)assertion_adapter)(assertion_adapter,&local_78);
    std::_Function_base::~_Function_base(&local_78);
    local_f8[0].run_after_eaches = &local_a0;
    local_f8[0].desc = &local_108;
    local_f8[0].we_have_been_successful_so_far = (bool *)&local_f9;
    local_f8[0].listener = listener;
    std::function<void()>::
    function<bandit::it(char_const*,std::function<void()>,bandit::detail::listener&,std::deque<bandit::detail::context*,std::allocator<bandit::detail::context*>>&,bandit::adapters::assertion_adapter&,bandit::detail::run_policy&)::_lambda()_4_,void>
              ((function<void()> *)&local_98,local_f8);
    (*(code *)**(undefined8 **)assertion_adapter)(assertion_adapter,&local_98);
    this = &local_98;
  }
  std::_Function_base::~_Function_base(&this->super__Function_base);
  return;
}

Assistant:

inline void it(const char* desc, detail::voidfunc_t func, detail::listener& listener,
      detail::contextstack_t& context_stack, 
      bandit::adapters::assertion_adapter& assertion_adapter, 
      detail::run_policy& run_policy)
  {
    if(!run_policy.should_run(desc, context_stack))
    {
      it_skip(desc, func, listener);
      return;
    }

    listener.it_starting(desc);

    context_stack.back()->execution_is_starting();

    auto run_before_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_before_eaches();
      });
    };

    auto run_after_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_after_eaches();
      });
    };

    bool we_have_been_successful_so_far = false;
    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_before_eaches();

          func();
          we_have_been_successful_so_far = true;
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }

    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_after_eaches();

          if(we_have_been_successful_so_far) 
          {
            listener.it_succeeded(desc);
          }
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }
  }